

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_zstd.c
# Opt level: O3

int archive_compressor_zstd_options(archive_write_filter *f,char *key,char *value)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  
  piVar1 = (int *)f->data;
  iVar2 = strcmp(key,"compression-level");
  if (iVar2 == 0) {
    iVar2 = atoi(value);
    iVar3 = string_is_numeric(value);
    if (iVar3 != 0) {
      return -0x14;
    }
    iVar3 = ZSTD_maxCLevel();
    uVar4 = ZSTD_versionNumber();
    if (uVar4 < 0x2842) {
      uVar4 = ZSTD_versionNumber();
      iVar5 = -99;
      if (uVar4 < 0x2840) {
        iVar5 = 0;
      }
    }
    else {
      iVar5 = ZSTD_minCLevel();
    }
    if (iVar3 < iVar2 || iVar2 < iVar5) {
      return -0x14;
    }
    *piVar1 = iVar2;
  }
  else {
    iVar2 = strcmp(key,"threads");
    if (iVar2 != 0) {
      return -0x14;
    }
    iVar2 = atoi(value);
    iVar3 = string_is_numeric(value);
    if (iVar2 < 0 || iVar3 != 0) {
      return -0x14;
    }
    piVar1[1] = iVar2;
  }
  return 0;
}

Assistant:

static int
archive_compressor_zstd_options(struct archive_write_filter *f, const char *key,
    const char *value)
{
	struct private_data *data = (struct private_data *)f->data;

	if (strcmp(key, "compression-level") == 0) {
		int level = atoi(value);
		/* If we don't have the library, hard-code the max level */
		int minimum = CLEVEL_MIN;
		int maximum = CLEVEL_MAX;
		if (string_is_numeric(value) != ARCHIVE_OK) {
			return (ARCHIVE_WARN);
		}
#if HAVE_ZSTD_H && HAVE_LIBZSTD_COMPRESSOR
		maximum = ZSTD_maxCLevel();
#if ZSTD_VERSION_NUMBER >= MINVER_MINCLEVEL
		if (ZSTD_versionNumber() >= MINVER_MINCLEVEL) {
			minimum = ZSTD_minCLevel();
		}
		else
#endif
		if (ZSTD_versionNumber() < MINVER_NEGCLEVEL) {
			minimum = CLEVEL_STD_MIN;
		}
#endif
		if (level < minimum || level > maximum) {
			return (ARCHIVE_WARN);
		}
		data->compression_level = level;
		return (ARCHIVE_OK);
	} else if (strcmp(key, "threads") == 0) {
		int threads = atoi(value);
		if (string_is_numeric(value) != ARCHIVE_OK) {
			return (ARCHIVE_WARN);
		}

		int minimum = 0;

		if (threads < minimum) {
			return (ARCHIVE_WARN);
		}

		data->threads = threads;
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}